

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void mbc2_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  u16 bank;
  undefined6 in_register_00000032;
  uint uVar1;
  
  uVar1 = (uint)CONCAT62(in_register_00000032,addr);
  if (uVar1 < 0x4000) {
    if ((uVar1 >> 8 & 1) != 0) {
      uVar1 = s_rom_bank_count[e->cart_info->rom_size] - 1 & (uint)(value & 0xf);
      bank = (u16)uVar1;
      if (uVar1 == 0) {
        bank = 1;
      }
      set_rom_bank(e,1,bank);
      return;
    }
    (e->state).memory_map_state.ext_ram_enabled = (uint)((value & 0xf) == 10);
  }
  return;
}

Assistant:

static void mbc2_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  if (addr < 0x4000) {
    if ((addr & MBC2_ADDR_SELECT_BIT_MASK) != 0) {
      u16 rom1_bank = value & MBC2_ROM_BANK_SELECT_MASK & ROM_BANK_MASK(e);
      if (rom1_bank == 0) {
        rom1_bank++;
      }
      set_rom_bank(e, 1, rom1_bank);
    } else {
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
    }
  }
}